

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O3

void __thiscall
RuntimeFunctionAnalyser::visit(RuntimeFunctionAnalyser *this,RuntimeFunctionSymbol *symbol)

{
  this->symbolValid_ = true;
  if (&this->arguments_ != &symbol->arguments_) {
    std::__cxx11::
    list<std::pair<std::__cxx11::string,TypeName>,std::allocator<std::pair<std::__cxx11::string,TypeName>>>
    ::_M_assign_dispatch<std::_List_const_iterator<std::pair<std::__cxx11::string,TypeName>>>
              ((list<std::pair<std::__cxx11::string,TypeName>,std::allocator<std::pair<std::__cxx11::string,TypeName>>>
                *)&this->arguments_,
               (symbol->arguments_).
               super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
               ._M_impl._M_node.super__List_node_base._M_next);
  }
  (this->returnType_).super__Optional_base<TypeName,_true,_true>._M_payload.
  super__Optional_payload_base<TypeName> =
       (_Optional_payload_base<TypeName>)((ulong)symbol->returnType_ | 0x100000000);
  (this->body_).super___shared_ptr<BlockNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (symbol->body_).super___shared_ptr<BlockNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->body_).super___shared_ptr<BlockNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(symbol->body_).super___shared_ptr<BlockNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  return;
}

Assistant:

void RuntimeFunctionAnalyser::visit(RuntimeFunctionSymbol& symbol)
{
  symbolValid_ = true;
  arguments_ = symbol.getArguments();
  returnType_ = symbol.getReturnType();
  body_ = symbol.getBody();
}